

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_analyze_anchor(yaml_emitter_t *emitter,yaml_char_t *anchor,int alias)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  byte *pbVar6;
  long lVar7;
  
  sVar3 = strlen((char *)anchor);
  if (sVar3 == 0) {
    pcVar4 = "anchor value must not be empty";
    pcVar5 = "alias value must not be empty";
LAB_0010a0e8:
    if (alias == 0) {
      pcVar5 = pcVar4;
    }
    emitter->error = YAML_EMITTER_ERROR;
    emitter->problem = pcVar5;
    iVar2 = 0;
  }
  else {
    pbVar6 = anchor;
    do {
      bVar1 = *pbVar6;
      if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) && (bVar1 != 0x2d)
          ) && (bVar1 != 0x5f)) {
        pcVar4 = "anchor value must contain alphanumerical characters only";
        pcVar5 = "alias value must contain alphanumerical characters only";
        goto LAB_0010a0e8;
      }
      lVar7 = 1;
      if ((((char)bVar1 < '\0') && (lVar7 = 2, (bVar1 & 0xe0) != 0xc0)) &&
         (lVar7 = 3, (bVar1 & 0xf0) != 0xe0)) {
        lVar7 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      pbVar6 = pbVar6 + lVar7;
    } while (pbVar6 != anchor + sVar3);
    (emitter->anchor_data).anchor = anchor;
    (emitter->anchor_data).anchor_length = sVar3;
    (emitter->anchor_data).alias = alias;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
yaml_emitter_analyze_anchor(yaml_emitter_t *emitter,
        yaml_char_t *anchor, int alias)
{
    size_t anchor_length;
    yaml_string_t string;

    anchor_length = strlen((char *)anchor);
    STRING_ASSIGN(string, anchor, anchor_length);

    if (string.start == string.end) {
        return yaml_emitter_set_emitter_error(emitter, alias ?
                "alias value must not be empty" :
                "anchor value must not be empty");
    }

    while (string.pointer != string.end) {
        if (!IS_ALPHA(string)) {
            return yaml_emitter_set_emitter_error(emitter, alias ?
                    "alias value must contain alphanumerical characters only" :
                    "anchor value must contain alphanumerical characters only");
        }
        MOVE(string);
    }

    emitter->anchor_data.anchor = string.start;
    emitter->anchor_data.anchor_length = string.end - string.start;
    emitter->anchor_data.alias = alias;

    return 1;
}